

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_LogicalOrExprPrecedence_Test::TestBody
          (ExprWriterTest_LogicalOrExprPrecedence_Test *this)

{
  LogicalExpr lhs;
  LogicalExpr lhs_00;
  NumericExpr else_expr;
  LogicalExpr lhs_01;
  LogicalExpr lhs_02;
  NumericExpr else_expr_00;
  LogicalExpr lhs_03;
  LogicalExpr lhs_04;
  NumericExpr else_expr_01;
  CStringRef arg0;
  CStringRef arg0_00;
  CStringRef arg0_01;
  bool bVar1;
  AssertHelper *this_00;
  AssertHelper *this_01;
  ExprBase other;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  NumericConstant n1;
  NumericConstant n0;
  ExprWriterTest *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  ExprBase in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  int line;
  ExprBase in_stack_fffffffffffffd00;
  char *file;
  ExprBase in_stack_fffffffffffffd08;
  Type type;
  AssertHelper *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 uVar4;
  char local_1f8 [8];
  BasicCStringRef<char> local_1f0;
  string local_1e8 [32];
  AssertionResult local_1c8 [2];
  Impl *local_1a8;
  Impl *local_198;
  undefined8 local_188;
  undefined8 local_178;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_168;
  undefined8 local_158;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_148;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_138;
  BasicCStringRef<char> local_128;
  string local_120 [32];
  AssertionResult local_100 [3];
  Impl *local_d0;
  Impl *local_c0;
  undefined8 local_b0;
  undefined8 local_a0;
  undefined8 local_90;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_80;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_70;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_60;
  BasicCStringRef<char> local_50;
  string local_48 [32];
  AssertionResult local_28;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_18;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_10;
  
  local_10.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffcd8,6.00690941001538e-318);
  local_18.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffcd8,6.0070378670833e-318);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_50,"{}");
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_90 = *(undefined8 *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (LogicalConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_a0 = *(undefined8 *)(in_RDI + 0x50);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (LogicalConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  uVar4 = 0x32;
  lhs.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffcfc;
  lhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffcf8;
  local_80.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                  (Kind)((ulong)in_stack_fffffffffffffce0 >> 0x20),lhs,
                  (LogicalExpr)in_stack_fffffffffffffcf0.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffcf0.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_b0 = *(undefined8 *)(in_RDI + 0x50);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (LogicalConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  lhs_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffcfc;
  lhs_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffcf8;
  local_70.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                  (Kind)((ulong)in_stack_fffffffffffffce0 >> 0x20),lhs_00,
                  (LogicalExpr)in_stack_fffffffffffffcf0.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffcf0.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_c0 = (Impl *)local_18.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (NumericConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_d0 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (NumericConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  else_expr.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffcfc;
  else_expr.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffcf8;
  local_60.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffcf0.impl_,
                  (LogicalExpr)in_stack_fffffffffffffd08.impl_,
                  (NumericExpr)in_stack_fffffffffffffd00.impl_,else_expr);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             in_stack_fffffffffffffcf0.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  arg0.data_._4_4_ = in_stack_fffffffffffffd1c;
  arg0.data_._0_4_ = in_stack_fffffffffffffd18;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffd10);
  testing::internal::EqHelper<false>::Compare<char[22],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
             (char *)in_stack_fffffffffffffcf0.impl_,
             (char (*) [22])CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0);
  std::__cxx11::string::~string(local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::AssertionResult::failure_message((AssertionResult *)0x12902b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,(Type)((ulong)in_stack_fffffffffffffd08.impl_ >> 0x20),
               (char *)in_stack_fffffffffffffd00.impl_,in_stack_fffffffffffffcfc,
               (char *)in_stack_fffffffffffffcf0.impl_);
    testing::internal::AssertHelper::operator=
              (this_01,(Message *)CONCAT44(uVar4,in_stack_fffffffffffffd58));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    testing::Message::~Message((Message *)0x129088);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1290e0);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_128,"{}");
  local_158 = *(undefined8 *)(in_RDI + 0x48);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (LogicalConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_178 = *(undefined8 *)(in_RDI + 0x50);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (LogicalConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_188 = *(undefined8 *)(in_RDI + 0x50);
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (LogicalConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  uVar3 = 0x32;
  lhs_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffcfc;
  lhs_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffcf8;
  local_168.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                  (Kind)((ulong)in_stack_fffffffffffffce0 >> 0x20),lhs_01,
                  (LogicalExpr)in_stack_fffffffffffffcf0.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffcf0.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  lhs_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffcfc;
  lhs_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffcf8;
  local_148.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                  (Kind)((ulong)in_stack_fffffffffffffce0 >> 0x20),lhs_02,
                  (LogicalExpr)in_stack_fffffffffffffcf0.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffcf0.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_198 = (Impl *)local_18.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (NumericConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_1a8 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (NumericConstant)in_stack_fffffffffffffcf0.impl_,
             (type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  else_expr_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffcfc;
  else_expr_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffcf8;
  local_138.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffcf0.impl_,
                  (LogicalExpr)in_stack_fffffffffffffd08.impl_,
                  (NumericExpr)in_stack_fffffffffffffd00.impl_,else_expr_00);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             in_stack_fffffffffffffcf0.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  arg0_00.data_._4_4_ = uVar3;
  arg0_00.data_._0_4_ = in_stack_fffffffffffffd18;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0_00,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffd10);
  testing::internal::EqHelper<false>::Compare<char[24],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
             (char *)in_stack_fffffffffffffcf0.impl_,
             (char (*) [24])CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0);
  std::__cxx11::string::~string(local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    in_stack_fffffffffffffd10 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x129381);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,(Type)((ulong)in_stack_fffffffffffffd08.impl_ >> 0x20),
               (char *)in_stack_fffffffffffffd00.impl_,in_stack_fffffffffffffcfc,
               (char *)in_stack_fffffffffffffcf0.impl_);
    testing::internal::AssertHelper::operator=
              (this_01,(Message *)CONCAT44(uVar4,in_stack_fffffffffffffd58));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    testing::Message::~Message((Message *)0x1293de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129436);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_1f0,"{}");
  other.impl_ = (Impl *)(in_RDI + 0x10);
  line = 0;
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (LogicalConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (LogicalConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (LogicalConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  lhs_03.super_ExprBase.impl_._4_4_ = line;
  lhs_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffcf8;
  mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (Kind)((ulong)in_stack_fffffffffffffce0 >> 0x20),lhs_03,(LogicalExpr)other.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )other.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  lhs_04.super_ExprBase.impl_._4_4_ = line;
  lhs_04.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffcf8;
  mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (Kind)((ulong)in_stack_fffffffffffffce0 >> 0x20),lhs_04,(LogicalExpr)other.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )other.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (NumericConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (NumericConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  else_expr_01.super_ExprBase.impl_._4_4_ = line;
  else_expr_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffcf8;
  mp::BasicExprFactory<std::allocator<char>_>::MakeIf
            ((BasicExprFactory<std::allocator<char>_> *)other.impl_,
             (LogicalExpr)in_stack_fffffffffffffd08.impl_,
             (NumericExpr)in_stack_fffffffffffffd00.impl_,else_expr_01);
  file = local_1f8;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             other.impl_,(type)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  type = (Type)((ulong)local_1e8 >> 0x20);
  arg0_01.data_._4_4_ = uVar3;
  arg0_01.data_._0_4_ = uVar2;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0_01,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffd10);
  testing::internal::EqHelper<false>::Compare<char[22],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffcf8),(char *)other.impl_,
             (char (*) [22])CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
             in_stack_fffffffffffffce0);
  std::__cxx11::string::~string(local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1296d4)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd10,type,file,line,(char *)other.impl_);
    testing::internal::AssertHelper::operator=
              (this_01,(Message *)CONCAT44(uVar4,in_stack_fffffffffffffd58));
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x129731);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x129786);
  return;
}

Assistant:

TEST_F(ExprWriterTest, LogicalOrExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if 0 || 1 || 1 then 1",
      MakeIf(MakeBinaryLogical(ex::OR, MakeBinaryLogical(ex::OR, l0, l1), l1),
          n1, n0));
  CHECK_WRITE("if 0 || (1 || 1) then 1",
      MakeIf(MakeBinaryLogical(ex::OR, l0, MakeBinaryLogical(ex::OR, l1, l1)),
          n1, n0));
  CHECK_WRITE("if 0 || 1 && 1 then 1",
      MakeIf(MakeBinaryLogical(ex::OR, l0, MakeBinaryLogical(ex::AND, l1, l1)),
          n1, n0));
}